

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O1

void __thiscall
Diligent::DeviceContextVkImpl::MapBuffer
          (DeviceContextVkImpl *this,IBuffer *pBuffer,MAP_TYPE MapType,MAP_FLAGS MapFlags,
          PVoid *pMappedData)

{
  IBuffer *Args;
  vector<Diligent::DeviceContextVkImpl::MappedBuffer,_std::allocator<Diligent::DeviceContextVkImpl::MappedBuffer>_>
  *this_00;
  byte bVar1;
  uint uVar2;
  VulkanDynamicMemoryManager *pVVar3;
  Int32 IVar4;
  Uint8 *pUVar5;
  ulong uVar6;
  char (*Args_2) [115];
  IndexWrapper<unsigned_char,_Diligent::_DeviceContextIndexTag> *in_R9;
  ulong uVar7;
  pointer pMVar8;
  string msg;
  undefined1 local_68 [16];
  undefined1 local_58 [32];
  vector<Diligent::DeviceContextVkImpl::MappedBuffer,_std::allocator<Diligent::DeviceContextVkImpl::MappedBuffer>_>
  *local_38;
  
  Args_2 = (char (*) [115])pMappedData;
  DeviceContextBase<Diligent::EngineVkImplTraits>::MapBuffer
            ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this,pBuffer,MapType,MapFlags,
             pMappedData);
  if (pBuffer != (IBuffer *)0x0) {
    CheckDynamicType<Diligent::BufferVkImpl,Diligent::IBuffer>(pBuffer);
  }
  if (MapType == MAP_READ_WRITE) {
    LogError<false,char[50]>
              (false,"MapBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x8b8,(char (*) [50])"MAP_READ_WRITE is not supported in Vulkan backend");
    return;
  }
  if (MapType == MAP_WRITE) {
    bVar1 = *(byte *)((long)&pBuffer[5].super_IDeviceObject.super_IObject._vptr_IObject + 4);
    if (1 < bVar1 - 3) {
      if (bVar1 != 2) {
        LogError<false,char[93]>
                  (false,"MapBuffer",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,0x8b3,(char (*) [93])
                          "Only USAGE_DYNAMIC, USAGE_STAGING and USAGE_UNIFIED Vulkan buffers can be mapped for writing"
                  );
        return;
      }
      Args = pBuffer + 3;
      if ((MapFlags & (MAP_FLAG_NO_OVERWRITE|MAP_FLAG_DISCARD)) == MAP_FLAG_NONE) {
        local_58[0x17] =
             (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
             super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_Desc.ContextId;
        Args_2 = (char (*) [115])(local_58 + 0x17);
        FormatString<char[23],char_const*,char[110],Diligent::IndexWrapper<unsigned_char,Diligent::_DeviceContextIndexTag>>
                  ((string *)local_68,(Diligent *)"Failed to map buffer \'",(char (*) [23])Args,
                   (char **)
                   "\': Vulkan buffer must be mapped for writing with MAP_FLAG_DISCARD or MAP_FLAG_NO_OVERWRITE flag. Context Id: "
                   ,(char (*) [110])Args_2,in_R9);
        DebugAssertionFailed
                  ((Char *)local_68._0_8_,"MapBuffer",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,0x889);
        if ((VulkanDynamicMemoryManager *)local_68._0_8_ !=
            (VulkanDynamicMemoryManager *)(local_68 + 0x10)) {
          operator_delete((void *)local_68._0_8_,local_58._0_8_ + 1);
        }
      }
      uVar2 = *(uint *)&pBuffer[0xc].super_IDeviceObject.super_IObject._vptr_IObject;
      uVar7 = (ulong)uVar2;
      local_58._24_8_ = Args;
      if (uVar7 == 0xffffffff) {
        FormatString<char[17],char_const*,char[34]>
                  ((string *)local_68,(Diligent *)"Dynamic buffer \'",(char (*) [17])Args,
                   (char **)"\' does not have dynamic buffer ID",(char (*) [34])Args_2);
        DebugAssertionFailed
                  ((Char *)local_68._0_8_,"MapBuffer",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,0x88c);
        if ((VulkanDynamicMemoryManager *)local_68._0_8_ !=
            (VulkanDynamicMemoryManager *)(local_68 + 0x10)) {
          operator_delete((void *)local_68._0_8_,local_58._0_8_ + 1);
        }
      }
      this_00 = &this->m_MappedBuffers;
      uVar6 = ((long)(this->m_MappedBuffers).
                     super__Vector_base<Diligent::DeviceContextVkImpl::MappedBuffer,_std::allocator<Diligent::DeviceContextVkImpl::MappedBuffer>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->m_MappedBuffers).
                     super__Vector_base<Diligent::DeviceContextVkImpl::MappedBuffer,_std::allocator<Diligent::DeviceContextVkImpl::MappedBuffer>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
      if (uVar6 < uVar7 || uVar6 - uVar7 == 0) {
        std::
        vector<Diligent::DeviceContextVkImpl::MappedBuffer,_std::allocator<Diligent::DeviceContextVkImpl::MappedBuffer>_>
        ::resize(this_00,(ulong)(uVar2 + 1));
      }
      pMVar8 = (this_00->
               super__Vector_base<Diligent::DeviceContextVkImpl::MappedBuffer,_std::allocator<Diligent::DeviceContextVkImpl::MappedBuffer>_>
               )._M_impl.super__Vector_impl_data._M_start + uVar7;
      local_38 = this_00;
      IVar4 = DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
              ::GetUniqueID((DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                             *)pBuffer);
      (local_38->
      super__Vector_base<Diligent::DeviceContextVkImpl::MappedBuffer,_std::allocator<Diligent::DeviceContextVkImpl::MappedBuffer>_>
      )._M_impl.super__Vector_impl_data._M_start[uVar7].DvpBufferUID = IVar4;
      if (((MapFlags & MAP_FLAG_DISCARD) == MAP_FLAG_NONE) &&
         ((pMVar8->Allocation).pDynamicMemMgr != (VulkanDynamicMemoryManager *)0x0)) {
        if ((MapFlags & MAP_FLAG_NO_OVERWRITE) == MAP_FLAG_NONE) {
          FormatString<char[9],char_const*,char[115]>
                    ((string *)local_68,(Diligent *)0x8239f8,(char (*) [9])local_58._24_8_,
                     (char **)
                     "\' is already mapped. Vulkan buffer must be mapped for writing with MAP_FLAG_DISCARD or MAP_FLAG_NO_OVERWRITE flag."
                     ,Args_2);
          DebugAssertionFailed
                    ((Char *)local_68._0_8_,"MapBuffer",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                     ,0x899);
          if ((VulkanDynamicMemoryManager *)local_68._0_8_ !=
              (VulkanDynamicMemoryManager *)(local_68 + 0x10)) {
            operator_delete((void *)local_68._0_8_,local_58._0_8_ + 1);
          }
        }
        if (pBuffer[0x15].super_IDeviceObject.super_IObject._vptr_IObject != (_func_int **)0x0) {
          LogError<false,char[398]>
                    (false,"MapBuffer",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                     ,0x8a0,(char (*) [398])
                            "Formatted or structured buffers require actual Vulkan backing resource and cannot be suballocated from dynamic heap. In current implementation, the entire contents of the backing buffer is updated when the buffer is unmapped. As a consequence, the buffer cannot be mapped with MAP_FLAG_NO_OVERWRITE flag because updating the whole buffer will overwrite regions that may still be in use by the GPU."
                    );
          return;
        }
      }
      else {
        AllocateDynamicSpace
                  ((VulkanDynamicAllocation *)local_68,this,
                   (Uint64)pBuffer[4].super_IDeviceObject.super_IObject._vptr_IObject,
                   *(Uint32 *)&pBuffer[0x11].super_IDeviceObject.super_IObject._vptr_IObject);
        (pMVar8->Allocation).pDynamicMemMgr = (VulkanDynamicMemoryManager *)local_68._0_8_;
        (pMVar8->Allocation).AlignedOffset = local_68._8_8_;
        (pMVar8->Allocation).Size = local_58._0_8_;
        (pMVar8->Allocation).dvpFrameNumber = local_58._8_8_;
      }
      pVVar3 = (pMVar8->Allocation).pDynamicMemMgr;
      if (pVVar3 == (VulkanDynamicMemoryManager *)0x0) {
        pUVar5 = (Uint8 *)0x0;
      }
      else {
        pUVar5 = pVVar3->m_CPUAddress + (pMVar8->Allocation).AlignedOffset;
      }
      goto LAB_0028e7d0;
    }
  }
  else {
    if (MapType != MAP_READ) {
      FormatString<char[17]>((string *)local_68,(char (*) [17])"Unknown map type");
      DebugAssertionFailed
                ((Char *)local_68._0_8_,"MapBuffer",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                 ,0x8bc);
      if ((VulkanDynamicMemoryManager *)local_68._0_8_ ==
          (VulkanDynamicMemoryManager *)(local_68 + 0x10)) {
        return;
      }
      operator_delete((void *)local_68._0_8_,local_58._0_8_ + 1);
      return;
    }
    if (1 < (byte)(*(char *)((long)&pBuffer[5].super_IDeviceObject.super_IObject._vptr_IObject + 4)
                  - 3U)) {
      FormatString<char[82]>
                ((string *)local_68,
                 (char (*) [82])
                 "Buffer must be created as USAGE_STAGING or USAGE_UNIFIED to be mapped for reading"
                );
      DebugAssertionFailed
                ((Char *)local_68._0_8_,"MapBuffer",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                 ,0x875);
      if ((VulkanDynamicMemoryManager *)local_68._0_8_ !=
          (VulkanDynamicMemoryManager *)(local_68 + 0x10)) {
        operator_delete((void *)local_68._0_8_,local_58._0_8_ + 1);
      }
    }
    if ((MapFlags & MAP_FLAG_DO_NOT_WAIT) == MAP_FLAG_NONE) {
      FormatString<char[207]>
                ((string *)local_68,
                 (char (*) [207])
                 "Vulkan backend never waits for GPU when mapping staging buffers for reading. Applications must use fences or other synchronization methods to explicitly synchronize access and use MAP_FLAG_DO_NOT_WAIT flag."
                );
      if (DebugMessageCallback != (undefined *)0x0) {
        (*(code *)DebugMessageCallback)(1,local_68._0_8_,0,0,0);
      }
      if ((VulkanDynamicMemoryManager *)local_68._0_8_ !=
          (VulkanDynamicMemoryManager *)(local_68 + 0x10)) {
        operator_delete((void *)local_68._0_8_,local_58._0_8_ + 1);
      }
    }
  }
  pUVar5 = (Uint8 *)BufferVkImpl::GetCPUAddress((BufferVkImpl *)pBuffer);
LAB_0028e7d0:
  *pMappedData = pUVar5;
  return;
}

Assistant:

void DeviceContextVkImpl::MapBuffer(IBuffer* pBuffer, MAP_TYPE MapType, MAP_FLAGS MapFlags, PVoid& pMappedData)
{
    TDeviceContextBase::MapBuffer(pBuffer, MapType, MapFlags, pMappedData);
    BufferVkImpl* const pBufferVk = ClassPtrCast<BufferVkImpl>(pBuffer);
    const BufferDesc&   BuffDesc  = pBufferVk->GetDesc();

    if (MapType == MAP_READ)
    {
        DEV_CHECK_ERR(BuffDesc.Usage == USAGE_STAGING || BuffDesc.Usage == USAGE_UNIFIED,
                      "Buffer must be created as USAGE_STAGING or USAGE_UNIFIED to be mapped for reading");

        if ((MapFlags & MAP_FLAG_DO_NOT_WAIT) == 0)
        {
            LOG_WARNING_MESSAGE("Vulkan backend never waits for GPU when mapping staging buffers for reading. "
                                "Applications must use fences or other synchronization methods to explicitly synchronize "
                                "access and use MAP_FLAG_DO_NOT_WAIT flag.");
        }

        pMappedData = pBufferVk->GetCPUAddress();
    }
    else if (MapType == MAP_WRITE)
    {
        if (BuffDesc.Usage == USAGE_STAGING || BuffDesc.Usage == USAGE_UNIFIED)
        {
            pMappedData = pBufferVk->GetCPUAddress();
        }
        else if (BuffDesc.Usage == USAGE_DYNAMIC)
        {
            DEV_CHECK_ERR((MapFlags & (MAP_FLAG_DISCARD | MAP_FLAG_NO_OVERWRITE)) != 0, "Failed to map buffer '",
                          BuffDesc.Name, "': Vulkan buffer must be mapped for writing with MAP_FLAG_DISCARD or MAP_FLAG_NO_OVERWRITE flag. Context Id: ", GetContextId());

            const Uint32 DynamicBufferId = pBufferVk->GetDynamicBufferId();
            VERIFY(DynamicBufferId != ~0u, "Dynamic buffer '", BuffDesc.Name, "' does not have dynamic buffer ID");
            if (m_MappedBuffers.size() <= DynamicBufferId)
                m_MappedBuffers.resize(DynamicBufferId + 1);
            VulkanDynamicAllocation& DynAllocation = m_MappedBuffers[DynamicBufferId].Allocation;
#ifdef DILIGENT_DEVELOPMENT
            m_MappedBuffers[DynamicBufferId].DvpBufferUID = pBufferVk->GetUniqueID();
#endif
            if ((MapFlags & MAP_FLAG_DISCARD) != 0 || !DynAllocation)
            {
                DynAllocation = AllocateDynamicSpace(BuffDesc.Size, pBufferVk->m_DynamicOffsetAlignment);
            }
            else
            {
                DEV_CHECK_ERR(MapFlags & MAP_FLAG_NO_OVERWRITE, "Buffer '", BuffDesc.Name, "' is already mapped. Vulkan buffer must be mapped for writing with MAP_FLAG_DISCARD or MAP_FLAG_NO_OVERWRITE flag.");

                if (pBufferVk->m_VulkanBuffer != VK_NULL_HANDLE)
                {
                    LOG_ERROR("Formatted or structured buffers require actual Vulkan backing resource and cannot be suballocated "
                              "from dynamic heap. In current implementation, the entire contents of the backing buffer is updated when the buffer is unmapped. "
                              "As a consequence, the buffer cannot be mapped with MAP_FLAG_NO_OVERWRITE flag because updating the whole "
                              "buffer will overwrite regions that may still be in use by the GPU.");
                    return;
                }

                // Reuse the same allocation
            }

            if (DynAllocation)
            {
                Uint8* CPUAddress = DynAllocation.pDynamicMemMgr->GetCPUAddress();
                pMappedData       = CPUAddress + DynAllocation.AlignedOffset;
            }
            else
            {
                pMappedData = nullptr;
            }
        }
        else
        {
            LOG_ERROR("Only USAGE_DYNAMIC, USAGE_STAGING and USAGE_UNIFIED Vulkan buffers can be mapped for writing");
        }
    }
    else if (MapType == MAP_READ_WRITE)
    {
        LOG_ERROR("MAP_READ_WRITE is not supported in Vulkan backend");
    }
    else
    {
        UNEXPECTED("Unknown map type");
    }
}